

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_test.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  ulong uVar2;
  ulong __val;
  uint __len;
  int iVar3;
  bool bVar4;
  string str;
  string sId;
  LogFile logfile;
  char *local_98;
  size_t local_90;
  char local_88 [16];
  char *local_78;
  size_t local_70;
  char local_68 [16];
  LogFile local_58;
  
  LogFile::LogFile(&local_58);
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = '\0';
  iVar3 = -0x1a;
  do {
    std::__cxx11::string::push_back((char)&local_98);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  __val = 0;
  do {
    __len = 1;
    if (9 < __val) {
      uVar2 = __val;
      uVar1 = 4;
      do {
        __len = uVar1;
        if (uVar2 < 100) {
          __len = __len - 2;
          goto LAB_00102886;
        }
        if (uVar2 < 1000) {
          __len = __len - 1;
          goto LAB_00102886;
        }
        if (uVar2 < 10000) goto LAB_00102886;
        bVar4 = 99999 < uVar2;
        uVar2 = uVar2 / 10000;
        uVar1 = __len + 4;
      } while (bVar4);
      __len = __len + 1;
    }
LAB_00102886:
    local_78 = local_68;
    std::__cxx11::string::_M_construct((ulong)&local_78,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_long_long>(local_78,__len,__val);
    LogFile::Append(&local_58,local_78,local_70);
    LogFile::Append(&local_58," : ",3);
    LogFile::Append(&local_58,local_98,local_90);
    LogFile::Append(&local_58,"\n",1);
    usleep(1000000);
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    bVar4 = __val == 0xb;
    __val = __val + 1;
    if (bVar4) {
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      LogFile::~LogFile(&local_58);
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	LogFile logfile;
	string str;
	for (int i = 0; i < 26; ++i)
	{
		str.push_back('a' + i);
	}
	
	for (long long i = 0; i < 100000000000000000; ++i)
	{
		string sId = to_string(i);
		logfile.Append(sId.c_str(), sId.size());
		logfile.Append(" : ", 3);
		logfile.Append(str.c_str(), str.size());
		logfile.Append("\n", 1);
		usleep(1000000);
		if (10 < i)
		{
			return 0;
		}
	}
}